

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

fio_ls_s * fio_ls_push(fio_ls_s *pos,void *obj)

{
  int *piVar1;
  fio_ls_s *item;
  void *obj_local;
  fio_ls_s *pos_local;
  
  if (pos == (fio_ls_s *)0x0) {
    pos_local = (fio_ls_s *)0x0;
  }
  else {
    pos_local = (fio_ls_s *)calloc(0x18,1);
    if (pos_local == (fio_ls_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:3313"
                      );
      }
      kill(0,2);
      piVar1 = __errno_location();
      exit(*piVar1);
    }
    pos_local->prev = pos->prev;
    pos_local->next = pos;
    pos_local->obj = obj;
    pos->prev->next = pos_local;
    pos->prev = pos_local;
  }
  return pos_local;
}

Assistant:

FIO_FUNC inline fio_ls_s *fio_ls_push(fio_ls_s *pos, const void *obj) {
  if (!pos)
    return NULL;
  /* prepare item */
  fio_ls_s *item = (fio_ls_s *)FIO_MALLOC(sizeof(*item));
  FIO_ASSERT_ALLOC(item);
  *item = (fio_ls_s){.prev = pos->prev, .next = pos, .obj = obj};
  /* inject item */
  pos->prev->next = item;
  pos->prev = item;
  return item;
}